

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O2

bool gutil::syncFileByName(char *name)

{
  int __fd;
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  __fd = open(name,0);
  if (__fd != -1) {
    iVar1 = fsync(__fd);
    bVar2 = iVar1 == 0;
    close(__fd);
  }
  return bVar2;
}

Assistant:

bool gutil::syncFileByName(const char *name)
{
  bool ret=false;
#if defined(__GNUC__) && !defined(__MINGW32__) 
  int fd=open(name, O_RDONLY);
  if (fd != -1)
  {
    if (fsync(fd) == 0)
    {
      ret=true;
    }

    close(fd);
  }
#endif

  return ret;
}